

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteView.h
# Opt level: O0

void __thiscall DeleteView<BaseUser>::display(DeleteView<BaseUser> *this)

{
  BaseUser *pBVar1;
  BaseUser *object;
  DeleteView<BaseUser> *this_local;
  
  pBVar1 = SingleObjectMixin<BaseUser>::getObject
                     (&this->super_SingleObjectMixin<BaseUser>,
                      (this->super_View).context.requestObjectId);
  if (pBVar1 == (BaseUser *)0x0) {
    std::operator<<((ostream *)&std::cout,"Not found.\n");
  }
  else {
    (*(pBVar1->super_Model<BaseUser>)._vptr_Model[1])();
    std::operator<<((ostream *)&std::cout,"Successfully deleted.\n");
  }
  return;
}

Assistant:

void DeleteView<T>::display() {
    T *object = SingleObjectMixin<T>::getObject(context.requestObjectId);
    if (object) {
        object->remove();
        cout << "Successfully deleted.\n";
    } else cout << "Not found.\n";
}